

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

bool __thiscall QPDF::JSONReactor::arrayItem(JSONReactor *this,JSON *value)

{
  bool bVar1;
  logic_error *this_00;
  reference pvVar2;
  qpdf_offset_t offset;
  undefined1 local_b0 [24];
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_49;
  string local_48;
  state_e local_28;
  state_e state;
  JSON *local_18;
  JSON *value_local;
  JSONReactor *this_local;
  
  local_18 = value;
  value_local = (JSON *)this;
  bVar1 = std::vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>
          ::empty(&this->stack);
  if (bVar1) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"stack is empty in arrayItem");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  this->next_state = st_ignore;
  pvVar2 = std::
           vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>::
           back(&this->stack);
  local_28 = pvVar2->state;
  if (local_28 == st_qpdf) {
    if ((this->saw_qpdf_meta & 1U) == 0) {
      this->saw_qpdf_meta = true;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"qpdf[0]",&local_49);
      setNextStateIfDictionary(this,&local_48,local_18,st_qpdf_meta);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
    }
    else if ((this->saw_objects & 1U) == 0) {
      this->saw_objects = true;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"qpdf[1]",&local_71);
      setNextStateIfDictionary(this,&local_70,local_18,st_objects);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
    }
    else {
      QTC::TC("qpdf","QPDF_json more than two qpdf elements",0);
      offset = JSON::getStart(local_18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"\"qpdf\" must have two elements",
                 (allocator<char> *)(local_b0 + 0x17));
      error(this,offset,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator((allocator<char> *)(local_b0 + 0x17));
    }
  }
  else if (local_28 == st_object) {
    pvVar2 = std::
             vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>::
             back(&this->stack);
    makeObject((JSONReactor *)local_b0,(JSON *)this);
    QPDFObjectHandle::appendItem(&pvVar2->object,(QPDFObjectHandle *)local_b0);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_b0);
  }
  return true;
}

Assistant:

bool
QPDF::JSONReactor::arrayItem(JSON const& value)
{
    if (stack.empty()) {
        throw std::logic_error("stack is empty in arrayItem");
    }
    next_state = st_ignore;
    auto state = stack.back().state;
    if (state == st_qpdf) {
        if (!this->saw_qpdf_meta) {
            this->saw_qpdf_meta = true;
            setNextStateIfDictionary("qpdf[0]", value, st_qpdf_meta);
        } else if (!this->saw_objects) {
            this->saw_objects = true;
            setNextStateIfDictionary("qpdf[1]", value, st_objects);
        } else {
            QTC::TC("qpdf", "QPDF_json more than two qpdf elements");
            error(value.getStart(), "\"qpdf\" must have two elements");
        }
    } else if (state == st_object) {
        stack.back().object.appendItem(makeObject(value));
    }
    return true;
}